

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  undefined1 *local_80;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string shader_source;
  TestShaderType tested_shader_type_local;
  ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  shader_source.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "const float[2][2] x = float[2][2](float[2](1.0, 2.0), float[2](3.0, 4.0));\n\n",
             &local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::operator+=((string *)local_38,(string *)shader_start_abi_cxx11_);
  switch(shader_source.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)local_38,"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)local_38,(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)local_38,(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x85f);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=((string *)local_38,(string *)shader_end_abi_cxx11_);
  vs = (string *)empty_string_abi_cxx11_;
  tcs = (string *)default_vertex_shader_source_abi_cxx11_;
  tes = (string *)default_tc_shader_source_abi_cxx11_;
  gs = (string *)default_te_shader_source_abi_cxx11_;
  fs = (string *)default_geometry_shader_source_abi_cxx11_;
  local_80 = default_fragment_shader_source_abi_cxx11_;
  switch(shader_source.field_2._12_4_) {
  case 0:
    local_80 = local_38;
    break;
  case 1:
    tcs = (string *)local_38;
    break;
  case 2:
    vs = (string *)local_38;
    tcs = (string *)empty_string_abi_cxx11_;
    tes = (string *)empty_string_abi_cxx11_;
    gs = (string *)empty_string_abi_cxx11_;
    fs = (string *)empty_string_abi_cxx11_;
    local_80 = empty_string_abi_cxx11_;
    break;
  case 3:
    fs = (string *)local_38;
    break;
  case 4:
    tes = (string *)local_38;
    break;
  case 5:
    gs = (string *)local_38;
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x862);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,tcs,tes,gs,fs,local_80,vs,1,0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclConst<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source = "const float[2][2] x = float[2][2](float[2](1.0, 2.0), float[2](3.0, 4.0));\n\n";
	shader_source += shader_start;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
}